

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O0

decNumber_conflict * decNumberLogB(decNumber_conflict *res,decNumber_conflict *rhs,decContext *set)

{
  uint32_t local_24;
  int32_t ae;
  uint32_t status;
  decContext *set_local;
  decNumber_conflict *rhs_local;
  decNumber_conflict *res_local;
  
  local_24 = 0;
  _ae = set;
  set_local = (decContext *)rhs;
  rhs_local = res;
  if ((rhs->bits & 0x30) == 0) {
    if ((rhs->bits & 0x40) == 0) {
      if (((rhs->lsu[0] == 0) && (rhs->digits == 1)) && ((rhs->bits & 0x70) == 0)) {
        decNumberZero(res);
        rhs_local->bits = 0xc0;
        local_24 = local_24 | 2;
      }
      else {
        decNumberFromInt32(res,rhs->exponent + rhs->digits + -1);
      }
    }
    else {
      decNumberCopyAbs(res,rhs);
    }
  }
  else {
    decNaNs(res,rhs,(decNumber_conflict *)0x0,set,&local_24);
  }
  if (local_24 != 0) {
    decStatus(rhs_local,local_24,_ae);
  }
  return rhs_local;
}

Assistant:

decNumber * decNumberLogB(decNumber *res, const decNumber *rhs,
			  decContext *set) {
  uInt status=0;		   /* accumulator */

  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  /* NaNs as usual; Infinities return +Infinity; 0->oops */
  if (decNumberIsNaN(rhs)) decNaNs(res, rhs, NULL, set, &status);
   else if (decNumberIsInfinite(rhs)) decNumberCopyAbs(res, rhs);
   else if (decNumberIsZero(rhs)) {
    decNumberZero(res);			/* prepare for Infinity */
    res->bits=DECNEG|DECINF;		/* -Infinity */
    status|=DEC_Division_by_zero;	/* as per 754r */
    }
   else { /* finite non-zero */
    Int ae=rhs->exponent+rhs->digits-1; /* adjusted exponent */
    decNumberFromInt32(res, ae);	/* lay it out */
    }

  if (status!=0) decStatus(res, status, set);
  return res;
  }